

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

void setup_hal_bufs(HalH264eVepu511Ctx *ctx)

{
  MppEncCfgSet *pMVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  MppEncCpbInfo *pMVar8;
  RK_S32 local_8c;
  int local_84;
  int local_80;
  size_t local_78;
  size_t sizes [3];
  RK_S32 ext_line_buf_size;
  RK_S32 ctu_w;
  MppEncCpbInfo *info;
  MppEncRefCfg ref_cfg;
  RK_S32 new_max_cnt;
  RK_S32 old_max_cnt;
  RK_S32 thumb_buf_size;
  RK_S32 pixel_buf_size;
  RK_S32 pixel_buf_fbc_bdy_size;
  RK_S32 pixel_buf_fbc_hdr_size;
  RK_S32 aligned_h;
  RK_S32 aligned_w;
  RK_S32 alignment_h;
  RK_S32 alignment_w;
  MppEncPrepCfg *prep;
  MppEncCfgSet *cfg;
  HalH264eVepu511Ctx *ctx_local;
  
  pMVar1 = ctx->cfg;
  uVar2 = (pMVar1->prep).width + 0x3fU & 0xffffffc0;
  iVar3 = ((pMVar1->prep).height + 0xfU & 0xfffffff0) + 0x10;
  uVar4 = (int)(uVar2 * iVar3) / 0x40 + 0x1fffU & 0xffffe000;
  iVar5 = (int)(uVar2 * iVar3 * 3) / 2;
  uVar6 = uVar4 + iVar5;
  uVar7 = ((((int)uVar2 / 0x40) * iVar3) / 0x40) * 0x100 + 0x1fffU & 0xffffe000;
  local_8c = ctx->max_buf_cnt;
  ref_cfg._0_4_ = 4;
  if (pMVar1->ref_cfg != (MppEncRefCfg)0x0) {
    pMVar8 = mpp_enc_ref_cfg_get_cpb_info(pMVar1->ref_cfg);
    if (pMVar8->dpb_size + 1 < 4) {
      local_80 = 4;
    }
    else {
      local_80 = pMVar8->dpb_size + 1;
    }
    if (4 < local_80) {
      if (pMVar8->dpb_size + 1 < 4) {
        local_84 = 4;
      }
      else {
        local_84 = pMVar8->dpb_size + 1;
      }
      ref_cfg._0_4_ = local_84;
    }
  }
  if ((int)uVar2 < 0x1001) {
    clear_ext_line_bufs(ctx);
    if (ctx->ext_line_buf_grp != (MppBufferGroup)0x0) {
      mpp_buffer_group_clear(ctx->ext_line_buf_grp);
      mpp_buffer_group_put(ctx->ext_line_buf_grp);
      ctx->ext_line_buf_grp = (MppBufferGroup)0x0;
    }
    ctx->ext_line_buf_size = 0;
  }
  else {
    sizes[2]._4_4_ = (int)(uVar2 + 0x3f) / 0x40;
    sizes[2]._0_4_ = ((sizes[2]._4_4_ + -0x35) * 0x35 + 0xf) / 0x10 << 8;
    if (ctx->ext_line_buf_grp == (MppBufferGroup)0x0) {
      mpp_buffer_group_get
                (&ctx->ext_line_buf_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h264e_vepu511",
                 "setup_hal_bufs");
    }
    else if ((int)sizes[2] != ctx->ext_line_buf_size) {
      clear_ext_line_bufs(ctx);
      mpp_buffer_group_clear(ctx->ext_line_buf_grp);
    }
    if ((ctx->ext_line_buf_grp == (MppBufferGroup)0x0) &&
       (_mpp_log_l(2,"hal_h264e_vepu511","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->ext_line_buf_grp","setup_hal_bufs",0x1ae), (mpp_debug & 0x10000000) != 0))
    {
      abort();
    }
    ctx->ext_line_buf_size = (int)sizes[2];
    setup_ext_line_bufs(ctx);
  }
  if ((((ctx->pixel_buf_fbc_hdr_size != uVar4) || (ctx->pixel_buf_fbc_bdy_size != iVar5)) ||
      (ctx->pixel_buf_size != uVar6)) ||
     ((ctx->thumb_buf_size != uVar7 || (local_8c < (int)ref_cfg)))) {
    if ((hal_h264e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu511","frame size %d -> %d max count %d -> %d\n","setup_hal_bufs",
                 (ulong)(uint)ctx->pixel_buf_size,(ulong)uVar6,local_8c,(int)ref_cfg);
    }
    local_78 = (size_t)(int)uVar6;
    sizes[0] = (size_t)(int)uVar7;
    sizes[1] = (size_t)(int)(((int)uVar2 / 0x40 + 0xfU & 0xfffffff0) *
                            (iVar3 / 0x10 + 0xfU & 0xfffffff0));
    if (local_8c < (int)ref_cfg) {
      local_8c = (int)ref_cfg;
    }
    hal_bufs_setup(ctx->hw_recn,local_8c,3,&local_78);
    ctx->pixel_buf_fbc_hdr_size = uVar4;
    ctx->pixel_buf_fbc_bdy_size = iVar5;
    ctx->pixel_buf_size = uVar6;
    ctx->thumb_buf_size = uVar7;
    ctx->max_buf_cnt = local_8c;
  }
  return;
}

Assistant:

static void setup_hal_bufs(HalH264eVepu540cCtx *ctx)
{
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    RK_S32 alignment = 64;
    RK_S32 aligned_w = MPP_ALIGN(prep->width,  alignment);
    RK_S32 aligned_h = MPP_ALIGN(prep->height, alignment);
    RK_S32 pixel_buf_fbc_hdr_size = MPP_ALIGN(aligned_w * aligned_h / 64, SZ_8K);
    RK_S32 pixel_buf_fbc_bdy_size = aligned_w * aligned_h * 3 / 2;
    RK_S32 pixel_buf_size = pixel_buf_fbc_hdr_size + pixel_buf_fbc_bdy_size;
    RK_S32 thumb_buf_size = MPP_ALIGN(aligned_w / 64 * aligned_h / 64 * 256, SZ_8K);
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 2;
    MppEncRefCfg ref_cfg = cfg->ref_cfg;

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        if (new_max_cnt < MPP_MAX(new_max_cnt, info->dpb_size + 1))
            new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (aligned_w > (3 * SZ_1K)) {
        RK_S32 ext_line_buf_size = (aligned_w / 64 - 36) * 56 * 16;

        if (NULL == ctx->ext_line_buf_grp)
            mpp_buffer_group_get_internal(&ctx->ext_line_buf_grp, MPP_BUFFER_TYPE_ION);
        else if (ext_line_buf_size != ctx->ext_line_buf_size) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        }

        mpp_assert(ctx->ext_line_buf_grp);

        if (NULL == ctx->ext_line_buf)
            mpp_buffer_get(ctx->ext_line_buf_grp, &ctx->ext_line_buf, ext_line_buf_size);

        ctx->ext_line_buf_size = ext_line_buf_size;
    } else {
        if (ctx->ext_line_buf) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
        }

        if (ctx->ext_line_buf_grp) {
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
            mpp_buffer_group_put(ctx->ext_line_buf_grp);
            ctx->ext_line_buf_grp = NULL;
        }
        ctx->ext_line_buf_size = 0;
    }

    if ((ctx->pixel_buf_fbc_hdr_size != pixel_buf_fbc_hdr_size) ||
        (ctx->pixel_buf_fbc_bdy_size != pixel_buf_fbc_bdy_size) ||
        (ctx->pixel_buf_size != pixel_buf_size) ||
        (ctx->thumb_buf_size != thumb_buf_size) ||
        (new_max_cnt > old_max_cnt)) {
        size_t sizes[2];

        hal_h264e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->pixel_buf_size, pixel_buf_size,
                             old_max_cnt, new_max_cnt);

        /* pixel buffer */
        sizes[0] = pixel_buf_size;
        /* thumb buffer */
        sizes[1] = thumb_buf_size;
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_bufs_setup(ctx->hw_recn, new_max_cnt, 2, sizes);

        ctx->pixel_buf_fbc_hdr_size = pixel_buf_fbc_hdr_size;
        ctx->pixel_buf_fbc_bdy_size = pixel_buf_fbc_bdy_size;
        ctx->pixel_buf_size = pixel_buf_size;
        ctx->thumb_buf_size = thumb_buf_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
}